

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O3

int nifti_copy_extensions(nifti_image *nim_dest,nifti_image *nim_src)

{
  uint uVar1;
  nifti1_extension *pnVar2;
  nifti1_extension *pnVar3;
  void *__dest;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  int local_34;
  
  if ((nim_dest->num_ext < 1) && (nim_dest->ext_list == (nifti1_extension *)0x0)) {
    if (1 < g_opts_0) {
      nifti_copy_extensions_cold_1();
    }
    uVar1 = nim_src->num_ext;
    if ((long)(int)uVar1 < 1) {
      return 0;
    }
    pnVar3 = (nifti1_extension *)malloc((long)(int)uVar1 << 4);
    nim_dest->ext_list = pnVar3;
    if (pnVar3 != (nifti1_extension *)0x0) {
      nim_dest->num_ext = 0;
      if (nim_src->num_ext < 1) {
        return 0;
      }
      pnVar3 = nim_src->ext_list;
      local_34 = g_opts_0;
      lVar5 = 0;
      uVar6 = 0;
      while( true ) {
        uVar1 = *(uint *)((long)&pnVar3->esize + lVar5);
        uVar4 = uVar1 + 0xf & 0xfffffff0;
        if (2 < local_34) {
          fprintf(_stderr,"+d dup\'ing ext #%d of size %d (from size %d)\n",uVar6 & 0xffffffff,
                  (ulong)uVar4,(ulong)uVar1);
          local_34 = g_opts_0;
        }
        __dest = calloc((long)(int)(uVar4 - 8),1);
        if (__dest == (void *)0x0) break;
        pnVar2 = nim_dest->ext_list;
        *(uint *)((long)&pnVar2->esize + lVar5) = uVar4;
        pnVar3 = nim_src->ext_list;
        *(undefined4 *)((long)&pnVar2->ecode + lVar5) =
             *(undefined4 *)((long)&pnVar3->ecode + lVar5);
        *(void **)((long)&pnVar2->edata + lVar5) = __dest;
        memcpy(__dest,*(void **)((long)&pnVar3->edata + lVar5),(long)(int)uVar1 - 8);
        nim_dest->num_ext = nim_dest->num_ext + 1;
        uVar6 = uVar6 + 1;
        lVar5 = lVar5 + 0x10;
        if ((long)nim_src->num_ext <= (long)uVar6) {
          return 0;
        }
      }
      fprintf(_stderr,"** failed to alloc %d bytes for extention\n",(ulong)uVar4);
      if (uVar6 != 0) {
        return -1;
      }
      free(nim_dest->ext_list);
      nim_dest->ext_list = (nifti1_extension *)0x0;
      return -1;
    }
    fprintf(_stderr,"** failed to allocate %d nifti1_extension structs\n",(ulong)uVar1);
  }
  else {
    nifti_copy_extensions_cold_2();
  }
  return -1;
}

Assistant:

int nifti_copy_extensions(nifti_image * nim_dest, const nifti_image * nim_src)
{
   char   * data;
   size_t   bytes;
   int      c, size, old_size;

   if( nim_dest->num_ext > 0 || nim_dest->ext_list != NULL ){
      fprintf(stderr,"** will not copy extensions over existing ones\n");
      return -1;
   }

   if( g_opts.debug > 1 )
      fprintf(stderr,"+d duplicating %d extension(s)\n", nim_src->num_ext);

   if( nim_src->num_ext <= 0 ) return 0;

   bytes = nim_src->num_ext * sizeof(nifti1_extension);  /* I'm lazy */
   nim_dest->ext_list = (nifti1_extension *)malloc(bytes);
   if( !nim_dest->ext_list ){
      fprintf(stderr,"** failed to allocate %d nifti1_extension structs\n",
              nim_src->num_ext);
      return -1;
   }

   /* copy the extension data */
   nim_dest->num_ext = 0;
   for( c = 0; c < nim_src->num_ext; c++ ){
      size = old_size = nim_src->ext_list[c].esize;
      if( size & 0xf ) size = (size + 0xf) & ~0xf; /* make multiple of 16 */
      if( g_opts.debug > 2 )
         fprintf(stderr,"+d dup'ing ext #%d of size %d (from size %d)\n",
                 c, size, old_size);
      /* data length is size-8, as esize includes space for esize and ecode */
      data = (char *)calloc(size-8,sizeof(char));      /* maybe size > old */
      if( !data ){
         fprintf(stderr,"** failed to alloc %d bytes for extention\n", size);
         if( c == 0 ) { free(nim_dest->ext_list); nim_dest->ext_list = NULL; }
         /* otherwise, keep what we have (a.o.t. deleting them all) */
         return -1;
      }
      /* finally, fill the new structure */
      nim_dest->ext_list[c].esize = size;
      nim_dest->ext_list[c].ecode = nim_src->ext_list[c].ecode;
      nim_dest->ext_list[c].edata = data;
      memcpy(data, nim_src->ext_list[c].edata, old_size-8);

      nim_dest->num_ext++;
   }

   return 0;
}